

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O1

pair<const_slang::ast::ClassType_*,_bool> slang::ast::Lookup::getContainingClass(Scope *scope)

{
  SymbolKind SVar1;
  ClassType *pCVar2;
  ClassType *pCVar3;
  undefined8 uVar4;
  ulong uVar5;
  long lVar6;
  pair<const_slang::ast::ClassType_*,_bool> pVar7;
  
  uVar4 = 0;
  do {
    pCVar2 = (ClassType *)scope->thisSym;
    SVar1 = (pCVar2->super_Type).super_Symbol.kind;
    uVar5 = (ulong)(SVar1 - StatementBlock);
    if (SVar1 - StatementBlock < 0x23) {
      if ((0x780004001U >> (uVar5 & 0x3f) & 1) == 0) {
        lVar6 = 0xc4;
        if (uVar5 != 6) {
          if (uVar5 != 10) goto LAB_00337462;
          lVar6 = 0xc0;
        }
        if ((*(byte *)((long)&(pCVar2->super_Type).super_Symbol.kind + lVar6) & 4) != 0) {
          uVar4 = 1;
        }
      }
    }
    else {
LAB_00337462:
      if (SVar1 != CovergroupType) {
        pCVar3 = (ClassType *)0x0;
        if (SVar1 == ClassType) {
          pCVar3 = pCVar2;
        }
        pVar7._8_8_ = uVar4;
        pVar7.first = pCVar3;
        return pVar7;
      }
    }
    scope = (pCVar2->super_Type).super_Symbol.parentScope;
  } while( true );
}

Assistant:

std::pair<const ClassType*, bool> Lookup::getContainingClass(const Scope& scope) {
    auto isClassElem = [](SymbolKind kind) {
        switch (kind) {
            case SymbolKind::StatementBlock:
            case SymbolKind::Subroutine:
            case SymbolKind::MethodPrototype:
            case SymbolKind::ConstraintBlock:
            case SymbolKind::RandSeqProduction:
            case SymbolKind::CovergroupBody:
            case SymbolKind::CovergroupType:
            case SymbolKind::Coverpoint:
            case SymbolKind::CoverCross:
                return true;
            default:
                return false;
        }
    };

    const Symbol* parent = &scope.asSymbol();
    bool inStatic = false;
    while (isClassElem(parent->kind)) {
        if (parent->kind == SymbolKind::Subroutine) {
            // Remember whether this was a static class method.
            if (parent->as<SubroutineSymbol>().flags.has(MethodFlags::Static))
                inStatic = true;
        }
        else if (parent->kind == SymbolKind::MethodPrototype) {
            if (parent->as<MethodPrototypeSymbol>().flags.has(MethodFlags::Static))
                inStatic = true;
        }

        auto parentScope = parent->getParentScope();
        SLANG_ASSERT(parentScope);
        parent = &parentScope->asSymbol();
    }

    if (parent->kind == SymbolKind::ClassType)
        return {&parent->as<ClassType>(), inStatic};

    return {nullptr, inStatic};
}